

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausibly
          (CompilerMain *this,Format format,ArrayPtr<const_unsigned_char> prefix)

{
  Plausibility PVar1;
  
  switch(format) {
  case BINARY:
    PVar1 = isPlausiblyBinary(this,prefix);
    return PVar1;
  case PACKED:
    PVar1 = isPlausiblyPacked(this,prefix);
    return PVar1;
  case FLAT:
  case CANONICAL:
    PVar1 = isPlausiblyFlat(this,prefix,1);
    return PVar1;
  case FLAT_PACKED:
    PVar1 = isPlausiblyPackedFlat(this,prefix);
    return PVar1;
  case TEXT:
    PVar1 = isPlausiblyText(this,prefix);
    return PVar1;
  case JSON:
    PVar1 = isPlausiblyJson(this,prefix);
    return PVar1;
  default:
    kj::_::unreachable();
  }
}

Assistant:

Plausibility isPlausibly(Format format, kj::ArrayPtr<const byte> prefix) {
    switch (format) {
      case Format::BINARY     : return isPlausiblyBinary    (prefix);
      case Format::PACKED     : return isPlausiblyPacked    (prefix);
      case Format::FLAT       : return isPlausiblyFlat      (prefix);
      case Format::FLAT_PACKED: return isPlausiblyPackedFlat(prefix);
      case Format::CANONICAL  : return isPlausiblyFlat      (prefix);
      case Format::TEXT       : return isPlausiblyText      (prefix);
      case Format::JSON       : return isPlausiblyJson      (prefix);
    }
    KJ_UNREACHABLE;
  }